

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

TestStatus * __thiscall
vkt::FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig>::iterate
          (TestStatus *__return_storage_ptr__,
          FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig> *this)

{
  Context *pCVar1;
  Function p_Var2;
  TestConfig_conflict in_stack_ffffffffffffff88;
  
  pCVar1 = (this->super_TestInstance).m_context;
  p_Var2 = (this->m_args).func;
  vkt::memory::anon_unknown_0::TestConfig::TestConfig
            ((TestConfig *)&stack0xffffffffffffff88,&(this->m_args).arg0);
  (*p_Var2)(__return_storage_ptr__,pCVar1,in_stack_ffffffffffffff88);
  vkt::memory::anon_unknown_0::TestConfig::~TestConfig((TestConfig *)&stack0xffffffffffffff88);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate				(void) { return m_args.func(m_context, m_args.arg0); }